

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O0

Ivy_Man_t * Ivy_ManStartFrom(Ivy_Man_t *p)

{
  int iVar1;
  Ivy_Man_t *p_00;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *pIVar3;
  void *pvVar4;
  int local_24;
  int i;
  Ivy_Obj_t *pObj;
  Ivy_Man_t *pNew;
  Ivy_Man_t *p_local;
  
  p_00 = Ivy_ManStart();
  pIVar2 = Ivy_ManConst1(p_00);
  pIVar3 = Ivy_ManConst1(p);
  pIVar3->pEquiv = pIVar2;
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vPis), local_24 < iVar1; local_24 = local_24 + 1) {
    pvVar4 = Vec_PtrEntry(p->vPis,local_24);
    pIVar2 = Ivy_ObjCreatePi(p_00);
    *(Ivy_Obj_t **)((long)pvVar4 + 0x48) = pIVar2;
  }
  return p_00;
}

Assistant:

Ivy_Man_t * Ivy_ManStartFrom( Ivy_Man_t * p )
{
    Ivy_Man_t * pNew;
    Ivy_Obj_t * pObj;
    int i;
    // create the new manager
    pNew = Ivy_ManStart();
    // create the PIs
    Ivy_ManConst1(p)->pEquiv = Ivy_ManConst1(pNew);
    Ivy_ManForEachPi( p, pObj, i )
        pObj->pEquiv = Ivy_ObjCreatePi(pNew);
    return pNew;
}